

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::log<char_const(&)[43],long,long,long,long>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [43],
               long *params_1,long *params_2,long *params_3,long *params_4)

{
  undefined4 in_register_00000014;
  long *params_00;
  long *params_01;
  long *params_02;
  long *params_03;
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> in_stack_fffffffffffffec8;
  ArrayDisposer **local_100;
  undefined1 local_a8 [8];
  String argValues [5];
  long *params_local_1;
  char (*params_local) [43];
  char *macroArgs_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  
  argValues[4].content.disposer = (ArrayDisposer *)params_1;
  str<char_const(&)[43]>
            ((String *)local_a8,(kj *)params,(char (*) [43])CONCAT44(in_register_00000014,severity))
  ;
  str<long&>((String *)&argValues[0].content.disposer,(kj *)argValues[4].content.disposer,params_00)
  ;
  str<long&>((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<long&>((String *)&argValues[2].content.disposer,(kj *)params_3,params_02);
  str<long&>((String *)&argValues[3].content.disposer,(kj *)params_4,params_03);
  AVar1 = arrayPtr<kj::String>((String *)local_a8,5);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)AVar1.ptr,in_stack_fffffffffffffec8);
  local_100 = &argValues[4].content.disposer;
  do {
    local_100 = local_100 + -3;
    String::~String((String *)local_100);
  } while (local_100 != (ArrayDisposer **)local_a8);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}